

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

DispatchBuilder * __thiscall kern::DispatchBuilder::filter(DispatchBuilder *this,FnFilter *func)

{
  undefined8 *puVar1;
  
  if (this->inner != (Dispatch *)0x0) {
    std::function<bool_(const_kern::Metadata_&)>::operator=(&this->inner->filter_func,func);
    return this;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_00108b70;
  __cxa_throw(puVar1,&BuilderReuseException::typeinfo,std::exception::~exception);
}

Assistant:

DispatchBuilder &DispatchBuilder::filter(FnFilter func) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        this->inner->filter_func = func;

        return *this;
    }